

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::getLineContinuationString_abi_cxx11_
          (string *__return_storage_ptr__,LineContinuationTest *this)

{
  GLuint GVar1;
  uint uVar2;
  bool bVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GVar1 = (this->m_test_case).m_repetitions;
  uVar2 = 0;
  do {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (GVar1 == 0) {
      return __return_storage_ptr__;
    }
    bVar3 = uVar2 < 0x13;
    uVar2 = uVar2 + 1;
  } while (bVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string LineContinuationTest::getLineContinuationString() const
{
	static const GLchar line_continuation_ending_dos[]  = { '\\', 0x0d, 0x0a, 0x00 };
	static const GLchar line_continuation_ending_unix[] = { '\\', 0x0a, 0x00 };

	std::string   result;
	const GLchar* selected_string;

	if (DOS == m_test_case.m_line_endings)
	{
		selected_string = line_continuation_ending_dos;
	}
	else
	{
		selected_string = line_continuation_ending_unix;
	}

	GLuint n_repetitions = (ONCE == m_test_case.m_repetitions) ? 1 : m_n_repetitions;

	for (GLuint i = 0; i < n_repetitions; ++i)
	{
		result.append(selected_string);
	}

	return result;
}